

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O2

void list_insert_before(list *list,list_elem *before,list_elem *e)

{
  list_elem *plVar1;
  list *plVar2;
  
  plVar1 = before->prev;
  e->prev = plVar1;
  e->next = before;
  plVar2 = (list *)&plVar1->next;
  if (plVar1 == (list_elem *)0x0) {
    plVar2 = list;
  }
  plVar2->head = e;
  before->prev = e;
  return;
}

Assistant:

void list_insert_before(struct list *list, struct list_elem *before, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    e->prev = before->prev;
    e->next = before;
    if (before->prev) before->prev->next = e;
    else list->head = e;
    before->prev = e;
    IFDEF_LOCK( spin_unlock(&list->lock); );
}